

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data,
                       MQTT_MESSAGE_DETAILS_LIST *mqttMsgEntry,uchar *payload,size_t len,
                       _Bool isDuplicate)

{
  _Bool urlencode;
  uint16_t packetId;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  bool bVar1;
  _Bool _Var2;
  MAP_RESULT MVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  STRING_HANDLE handle;
  MAP_HANDLE handle_00;
  STRING_HANDLE pSVar7;
  STRING_HANDLE pSVar8;
  char *pcVar9;
  LOGGER_LOG p_Var10;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *pIVar11;
  MQTT_MESSAGE_HANDLE handle_01;
  undefined7 in_register_00000081;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  char **propertyValues;
  char **propertyKeys;
  ulong local_68;
  undefined4 local_5c;
  MQTT_MESSAGE_DETAILS_LIST *local_58;
  char **local_50;
  uchar *local_48;
  size_t local_40;
  char **local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000081,isDuplicate);
  iotHubMessageHandle = mqttMsgEntry->iotHubMessageEntry->messageHandle;
  local_58 = mqttMsgEntry;
  local_48 = payload;
  local_40 = len;
  pcVar6 = STRING_c_str(transport_data->topic_MqttEvent);
  urlencode = transport_data->auto_url_encode_decode;
  handle = STRING_construct(pcVar6);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 == (LOGGER_LOG)0x0) goto LAB_00130c58;
    handle = (STRING_HANDLE)0x0;
    (*p_Var10)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,"addPropertiesTouMqttMessage",0x3ed,1,"Failed to create event topic string handle");
  }
  else {
    handle_00 = IoTHubMessage_Properties(iotHubMessageHandle);
    bVar1 = true;
    if (handle_00 == (MAP_HANDLE)0x0) {
LAB_00130674:
      sVar13 = 0;
    }
    else {
      MVar3 = Map_GetInternals(handle_00,&local_38,&local_50,&local_68);
      if (MVar3 == MAP_OK) {
        if (local_68 == 0) goto LAB_00130674;
        sVar13 = 0;
        do {
          if (urlencode == false) {
            pcVar6 = "&";
            if (sVar13 == local_68 - 1) {
              pcVar6 = "";
            }
            iVar4 = STRING_sprintf(handle,"%s=%s%s",local_38[sVar13],local_50[sVar13],pcVar6);
            if (iVar4 == 0) {
              bVar1 = true;
            }
            else {
              p_Var10 = xlogging_get_log_function();
              if (p_Var10 == (LOGGER_LOG)0x0) {
                bVar1 = false;
              }
              else {
                bVar1 = false;
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"addUserPropertiesTouMqttMessage",0x2dc,1,
                           "Failed constructing property string.");
              }
            }
          }
          else {
            pSVar7 = URL_EncodeString(local_38[sVar13]);
            pSVar8 = URL_EncodeString(local_50[sVar13]);
            if ((pSVar7 == (STRING_HANDLE)0x0) || (pSVar8 == (STRING_HANDLE)0x0)) {
              p_Var10 = xlogging_get_log_function();
              if (p_Var10 != (LOGGER_LOG)0x0) {
                iVar4 = 0x2cd;
                pcVar6 = "Failed URL Encoding properties";
                goto LAB_001305ef;
              }
LAB_001305fb:
              bVar1 = false;
            }
            else {
              pcVar6 = STRING_c_str(pSVar7);
              pcVar9 = STRING_c_str(pSVar8);
              pcVar12 = "&";
              if (sVar13 == local_68 - 1) {
                pcVar12 = "";
              }
              iVar4 = STRING_sprintf(handle,"%s=%s%s",pcVar6,pcVar9,pcVar12);
              if (iVar4 == 0) {
                bVar1 = true;
              }
              else {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 == (LOGGER_LOG)0x0) goto LAB_001305fb;
                iVar4 = 0x2d2;
                pcVar6 = "Failed constructing property string.";
LAB_001305ef:
                bVar1 = false;
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"addUserPropertiesTouMqttMessage",iVar4,1,pcVar6);
              }
            }
            STRING_delete(pSVar7);
            STRING_delete(pSVar8);
          }
          sVar13 = sVar13 + 1;
        } while ((bVar1) && (sVar13 < local_68));
      }
      else {
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          (*p_Var10)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"addUserPropertiesTouMqttMessage",0x2be,1,
                     "Failed to get the internals of the property map.");
        }
        sVar13 = 0;
        bVar1 = false;
      }
    }
    if (bVar1) {
      _Var2 = IoTHubMessage_IsSecurityMessage(iotHubMessageHandle);
      pcVar6 = IoTHubMessage_GetCorrelationId(iotHubMessageHandle);
      if (pcVar6 == (char *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = addSystemPropertyToTopicString(handle,sVar13,"cid",pcVar6,urlencode);
        sVar13 = sVar13 + 1;
      }
      if (iVar4 == 0) {
        pcVar6 = IoTHubMessage_GetMessageId(iotHubMessageHandle);
        if (pcVar6 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = addSystemPropertyToTopicString(handle,sVar13,"mid",pcVar6,urlencode);
          sVar13 = sVar13 + 1;
        }
      }
      if (iVar4 == 0) {
        pcVar6 = IoTHubMessage_GetContentTypeSystemProperty(iotHubMessageHandle);
        if (pcVar6 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = addSystemPropertyToTopicString(handle,sVar13,"ct",pcVar6,urlencode);
          sVar13 = sVar13 + 1;
        }
      }
      if (iVar4 == 0) {
        pcVar6 = IoTHubMessage_GetContentEncodingSystemProperty(iotHubMessageHandle);
        if (pcVar6 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = addSystemPropertyToTopicString
                            (handle,sVar13,"ce",pcVar6,(_Bool)(_Var2 | urlencode));
          sVar13 = sVar13 + 1;
        }
      }
      if (iVar4 == 0) {
        pcVar6 = IoTHubMessage_GetMessageCreationTimeUtcSystemProperty(iotHubMessageHandle);
        if (pcVar6 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = addSystemPropertyToTopicString(handle,sVar13,"ctime",pcVar6,urlencode);
          sVar13 = sVar13 + 1;
        }
      }
      if (iVar4 == 0 && _Var2) {
        sVar14 = sVar13 + 1;
        iVar4 = addSystemPropertyToTopicString
                          (handle,sVar13,"ifid","urn:azureiot:Security:SecurityAgent:1",true);
        sVar13 = sVar14;
        if (iVar4 == 0) {
          iVar4 = 0;
        }
        else {
          p_Var10 = xlogging_get_log_function();
          iVar4 = 0x36b;
          if (p_Var10 != (LOGGER_LOG)0x0) {
            (*p_Var10)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"addSystemPropertiesTouMqttMessage",0x36a,1,
                       "Failed setting Security interface id");
          }
        }
      }
      sVar14 = sVar13;
      if (iVar4 == 0) {
        pcVar6 = IoTHubMessage_GetOutputName(iotHubMessageHandle);
        bVar1 = true;
        if (pcVar6 != (char *)0x0) {
          sVar14 = sVar13 + 1;
          iVar4 = addSystemPropertyToTopicString(handle,sVar13,"on",pcVar6,urlencode);
          bVar1 = true;
          if (iVar4 != 0) {
            p_Var10 = xlogging_get_log_function();
            if (p_Var10 == (LOGGER_LOG)0x0) {
              bVar1 = false;
            }
            else {
              bVar1 = false;
              (*p_Var10)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addSystemPropertiesTouMqttMessage",0x37c,1,"Failed setting output name");
            }
          }
        }
      }
      else {
        bVar1 = false;
      }
      sVar13 = sVar14;
      if (bVar1) {
        pcVar6 = IoTHubMessage_GetComponentName(iotHubMessageHandle);
        bVar1 = true;
        if (pcVar6 != (char *)0x0) {
          sVar13 = sVar14 + 1;
          iVar4 = addSystemPropertyToTopicString(handle,sVar14,"sub",pcVar6,urlencode);
          bVar1 = true;
          if (iVar4 != 0) {
            p_Var10 = xlogging_get_log_function();
            if (p_Var10 == (LOGGER_LOG)0x0) {
              bVar1 = false;
            }
            else {
              bVar1 = false;
              (*p_Var10)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addSystemPropertiesTouMqttMessage",0x38e,1,
                         "Failed setting component name");
            }
          }
        }
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        pIVar11 = IoTHubMessage_GetDiagnosticPropertyData(iotHubMessageHandle);
        iVar4 = 0;
        if (pIVar11 != (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
          pcVar6 = pIVar11->diagnosticCreationTimeUtc;
          if (pcVar6 == (char *)0x0 || pIVar11->diagnosticId == (char *)0x0) {
            if (pIVar11->diagnosticId != (char *)0x0 || pcVar6 != (char *)0x0) {
              p_Var10 = xlogging_get_log_function();
              iVar4 = 0x3bb;
              if (p_Var10 != (LOGGER_LOG)0x0) {
                pcVar6 = "diagid and diagcreationtimeutc must be present simultaneously.";
                iVar5 = 0x3da;
LAB_00130c05:
                iVar4 = 0x3bb;
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"addDiagnosticPropertiesTouMqttMessage",iVar5,1,pcVar6);
              }
            }
          }
          else {
            pcVar9 = "&";
            if (sVar13 == 0) {
              pcVar9 = "";
            }
            iVar4 = 0;
            iVar5 = STRING_sprintf(handle,"%s%%24.%s=%s",pcVar9,"diagid");
            if (iVar5 != 0) {
              p_Var10 = xlogging_get_log_function();
              iVar4 = 0x3b0;
              if (p_Var10 != (LOGGER_LOG)0x0) {
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"addDiagnosticPropertiesTouMqttMessage",0x3af,1,
                           "Failed setting diagnostic id");
              }
            }
            if (iVar5 == 0) {
              pSVar7 = STRING_construct_sprintf("%s=%s","creationtimeutc",pcVar6);
              if (pSVar7 == (STRING_HANDLE)0x0) {
                p_Var10 = xlogging_get_log_function();
                iVar4 = 0x3bb;
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  pcVar6 = "Failed constructing diagnostic context";
                  iVar5 = 0x3ba;
                  goto LAB_00130c05;
                }
              }
              else {
                pSVar8 = URL_Encode(pSVar7);
                if ((pSVar8 == (STRING_HANDLE)0x0) ||
                   (pcVar6 = STRING_c_str(pSVar8), pcVar6 == (char *)0x0)) {
                  p_Var10 = xlogging_get_log_function();
                  iVar4 = 0x3d0;
                  if (p_Var10 != (LOGGER_LOG)0x0) {
                    (*p_Var10)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addDiagnosticPropertiesTouMqttMessage",0x3cf,1,
                               "Failed encoding diagnostic context value");
                  }
                }
                else {
                  pcVar9 = "&";
                  if (sVar13 == 0xffffffffffffffff) {
                    pcVar9 = "";
                  }
                  iVar4 = 0;
                  iVar5 = STRING_sprintf(handle,"%s%%24.%s=%s",pcVar9,"diagctx",pcVar6);
                  if (iVar5 != 0) {
                    p_Var10 = xlogging_get_log_function();
                    iVar4 = 0x3c8;
                    if (p_Var10 != (LOGGER_LOG)0x0) {
                      (*p_Var10)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"addDiagnosticPropertiesTouMqttMessage",0x3c7,1,
                                 "Failed setting diagnostic context");
                    }
                  }
                  STRING_delete(pSVar8);
                }
                STRING_delete(pSVar7);
              }
            }
          }
        }
        if (iVar4 == 0) goto LAB_00130c5a;
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          pcVar6 = "Failed adding Diagnostic Properties to uMQTT Message";
          iVar4 = 0x3fd;
          goto LAB_00130c45;
        }
      }
      else {
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          pcVar6 = "Failed adding System Properties to uMQTT Message";
          iVar4 = 0x3f7;
LAB_00130c45:
          (*p_Var10)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"addPropertiesTouMqttMessage",iVar4,1,pcVar6);
        }
      }
      STRING_delete(handle);
LAB_00130c58:
      handle = (STRING_HANDLE)0x0;
    }
    else {
      p_Var10 = xlogging_get_log_function();
      if (p_Var10 != (LOGGER_LOG)0x0) {
        (*p_Var10)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"addPropertiesTouMqttMessage",0x3f1,1,
                   "Failed adding Properties to uMQTT Message");
      }
      STRING_delete(handle);
      handle = (STRING_HANDLE)0x0;
    }
  }
LAB_00130c5a:
  if (handle == (STRING_HANDLE)0x0) {
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 == (LOGGER_LOG)0x0) {
      return 0x40f;
    }
    (*p_Var10)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,"publishTelemetryMsg",0x40e,1,"Failed adding properties to mqtt message");
    return 0x40f;
  }
  packetId = local_58->packet_id;
  pcVar6 = STRING_c_str(handle);
  handle_01 = mqttmessage_create_in_place(packetId,pcVar6,DELIVER_AT_LEAST_ONCE,local_48,local_40);
  if (handle_01 == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var10 = xlogging_get_log_function();
    iVar4 = 0x417;
    if (p_Var10 != (LOGGER_LOG)0x0) {
      (*p_Var10)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"publishTelemetryMsg",0x416,1,"Failed creating mqtt message");
    }
    goto LAB_00130e0d;
  }
  iVar4 = mqttmessage_setIsDuplicateMsg(handle_01,local_5c._0_1_);
  if (iVar4 == 0) {
    iVar4 = tickcounter_get_current_ms(transport_data->msgTickCounter,&local_58->msgPublishTime);
    if (iVar4 == 0) {
      iVar4 = mqtt_client_publish(transport_data->mqttClient,handle_01);
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        p_Var10 = xlogging_get_log_function();
        iVar4 = 0x42a;
        if (p_Var10 != (LOGGER_LOG)0x0) {
          pcVar6 = "Failed attempting to publish mqtt message";
          iVar5 = 0x429;
          goto LAB_00130dfa;
        }
      }
    }
    else {
      p_Var10 = xlogging_get_log_function();
      iVar4 = 0x423;
      if (p_Var10 != (LOGGER_LOG)0x0) {
        pcVar6 = "Failed retrieving tickcounter info";
        iVar5 = 0x422;
        goto LAB_00130dfa;
      }
    }
  }
  else {
    p_Var10 = xlogging_get_log_function();
    iVar4 = 0x41e;
    if (p_Var10 != (LOGGER_LOG)0x0) {
      pcVar6 = "Failed setting DUP flag";
      iVar5 = 0x41d;
LAB_00130dfa:
      (*p_Var10)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"publishTelemetryMsg",iVar5,1,pcVar6);
    }
  }
  mqttmessage_destroy(handle_01);
LAB_00130e0d:
  STRING_delete(handle);
  return iVar4;
}

Assistant:

static int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data, MQTT_MESSAGE_DETAILS_LIST* mqttMsgEntry, const unsigned char* payload, size_t len, bool isDuplicate)
{
    int result;
    STRING_HANDLE msgTopic = addPropertiesTouMqttMessage(mqttMsgEntry->iotHubMessageEntry->messageHandle, STRING_c_str(transport_data->topic_MqttEvent), transport_data->auto_url_encode_decode);
    if (msgTopic == NULL)
    {
        LogError("Failed adding properties to mqtt message");
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE_HANDLE mqttMsg = mqttmessage_create_in_place(mqttMsgEntry->packet_id, STRING_c_str(msgTopic), DELIVER_AT_LEAST_ONCE, payload, len);
        if (mqttMsg == NULL)
        {
            LogError("Failed creating mqtt message");
            result = MU_FAILURE;
        }
        else
        {
            if (mqttmessage_setIsDuplicateMsg(mqttMsg, isDuplicate) != 0)
            {
                LogError("Failed setting DUP flag");
                result = MU_FAILURE;
            }
            else if (tickcounter_get_current_ms(transport_data->msgTickCounter, &mqttMsgEntry->msgPublishTime) != 0)
            {
                LogError("Failed retrieving tickcounter info");
                result = MU_FAILURE;
            }
            else
            {
                if (mqtt_client_publish(transport_data->mqttClient, mqttMsg) != 0)
                {
                    LogError("Failed attempting to publish mqtt message");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            mqttmessage_destroy(mqttMsg);
        }
        STRING_delete(msgTopic);
    }
    return result;
}